

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

_Bool bson_iter_as_bool(bson_iter_t *iter)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  _Bool _Var3;
  bool bVar4;
  
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x3b9,"bson_iter_as_bool","iter");
    abort();
  }
  puVar2 = iter->raw;
  uVar1 = puVar2[iter->type];
  switch(uVar1) {
  case '\x01':
    return (_Bool)(-(*(double *)(puVar2 + iter->d1) != 0.0) & 1);
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\a':
  case '\t':
    return true;
  case '\x06':
  case '\n':
    return false;
  case '\b':
    _Var3 = bson_iter_bool(iter);
    return _Var3;
  }
  if (uVar1 == '\x10') {
    bVar4 = *(int *)(puVar2 + iter->d1) == 0;
  }
  else {
    if (uVar1 != '\x12') {
      return true;
    }
    bVar4 = *(long *)(puVar2 + iter->d1) == 0;
  }
  return !bVar4;
}

Assistant:

bool
bson_iter_as_bool (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);

   switch ((int) ITER_TYPE (iter)) {
   case BSON_TYPE_BOOL:
      return bson_iter_bool (iter);
   case BSON_TYPE_DOUBLE:
      return !(bson_iter_double (iter) == 0.0);
   case BSON_TYPE_INT64:
      return !(bson_iter_int64 (iter) == 0);
   case BSON_TYPE_INT32:
      return !(bson_iter_int32 (iter) == 0);
   case BSON_TYPE_UTF8:
      return true;
   case BSON_TYPE_NULL:
   case BSON_TYPE_UNDEFINED:
      return false;
   default:
      return true;
   }
}